

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.c
# Opt level: O3

_Bool project(source origin,wchar_t rad,loc finish,wchar_t dam,wchar_t typ,wchar_t flg,
             wchar_t degrees_of_arc,uint8_t diameter_of_source,object *obj)

{
  ushort uVar1;
  wchar_t wVar2;
  int iVar3;
  chunk_conflict *pcVar4;
  player *p;
  anon_enum_32 aVar5;
  _Bool _Var6;
  wchar_t wVar7;
  loc lVar10;
  wchar_t wVar8;
  wchar_t wVar9;
  square *psVar11;
  loc_conflict lVar12;
  monster *pmVar13;
  int iVar14;
  wchar_t wVar15;
  wchar_t wVar16;
  undefined4 in_register_00000014;
  loc lVar17;
  long lVar18;
  void *pvVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  anon_union_8_4_b62eeb40_for_which aVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  byte bVar28;
  long lVar29;
  loc_conflict lVar30;
  bool bVar31;
  source origin_00;
  source origin_01;
  source origin_02;
  source origin_03;
  source origin_04;
  _Bool did_hit;
  _Bool was_obvious;
  ulong local_1de0;
  ulong local_1dd8;
  void *local_1dd0;
  loc_conflict local_1dc8;
  ulong local_1dc0;
  anon_enum_32 local_1db8;
  int16_t local_1db2;
  loc local_1db0;
  anon_union_8_4_b62eeb40_for_which local_1da8;
  ulong local_1da0;
  ulong local_1d98;
  loc local_1d90;
  ulong local_1d88;
  ulong local_1d80;
  wchar_t local_1d74;
  ulong local_1d70;
  ulong local_1d68;
  int local_1d5c;
  uint8_t *local_1d58;
  ulong local_1d50;
  long local_1d48;
  ulong local_1d40;
  wchar_t distance_to_grid [256];
  loc blast_grid [256];
  _Bool player_sees_grid [256];
  loc path_grid [512];
  
  p = player;
  local_1d98 = CONCAT44(in_register_00000014,rad);
  origin_00.which = origin.which;
  origin_00.what = origin.what;
  uVar26 = (ulong)finish >> 0x20;
  local_1db2 = player->timed[2];
  local_1d74 = dam;
  local_1dd0 = malloc((ulong)z_info->max_range * 4 + 4);
  handle_stuff(p);
  local_1dc0 = uVar26;
  if ((flg & 1U) == 0) {
    origin_00._4_4_ = 0;
    lVar10 = origin_get_loc(origin_00);
    local_1d90 = (loc)((ulong)lVar10 & 0xffffffff);
    local_1d88 = (ulong)lVar10 >> 0x20;
    if ((ulong)lVar10 >> 0x20 == 0xffffffff && lVar10.x == L'\xffffffff') {
      local_1d90 = (loc)((ulong)finish & 0xffffffff);
      local_1d88 = uVar26;
    }
  }
  else {
    flg = flg & 0xfffffffe;
    local_1d90 = (loc)((ulong)finish & 0xffffffff);
    local_1d88 = uVar26;
  }
  uVar26 = local_1d98;
  wVar15 = flg & 0xfffffbf8U | 6;
  if ((flg & 0x400U) == 0) {
    wVar15 = flg;
  }
  if (degrees_of_arc != L'\0') {
    wVar15 = flg;
  }
  wVar8 = (wchar_t)local_1d98;
  if (wVar8 == L'\0') {
    wVar15 = flg;
  }
  lVar10 = (loc)((ulong)local_1d90 | local_1d88 << 0x20);
  local_1db8 = origin_00.what;
  local_1da8 = origin_00.which;
  _Var6 = loc_eq((loc_conflict)lVar10,(loc_conflict)finish);
  local_1dd8 = (ulong)(uint)wVar15;
  if (_Var6) {
    blast_grid[0].y = (wchar_t)local_1dc0;
    distance_to_grid[0] = L'\0';
    local_1db0 = finish;
    blast_grid[0].x = finish.x;
    psVar11 = square(cave,finish);
    flag_on_dbg(psVar11->info,3,0x12,"square(cave, finish)->info","SQUARE_PROJECT");
    uVar25 = wVar15 & 2;
    local_1de0 = 1;
    uVar23 = 0;
    pvVar19 = local_1dd0;
  }
  else {
    wVar7 = project_path((chunk *)cave,path_grid,(uint)z_info->max_range,lVar10,finish,wVar15);
    uVar25 = wVar15 & 2;
    uVar23 = uVar26 & 0xffffffff;
    if (wVar7 < wVar8) {
      uVar23 = (ulong)(uint)wVar7;
    }
    if (uVar25 == 0) {
      uVar23 = (ulong)(uint)wVar7;
    }
    if (wVar8 < L'\x01') {
      uVar23 = (ulong)(uint)wVar7;
    }
    local_1de0 = 0;
    if ((((uint)wVar15 >> 10 & 1) == 0) && (0 < (int)uVar23)) {
      local_1dc8.x._0_1_ = wVar8 < L'\x01';
      local_1d70 = (ulong)((int)uVar23 - 1);
      local_1da0 = CONCAT71(local_1da0._1_7_,-1 < (char)wVar15 && local_1db2 == 0);
      uVar26 = 0;
      local_1de0 = 0;
      local_1db0 = local_1d90;
      local_1dc0 = local_1d88;
      lVar10 = local_1db0;
      local_1d80 = uVar23;
      local_1d68 = uVar23;
      do {
        local_1db0 = lVar10;
        pvVar19 = local_1dd0;
        wVar15 = path_grid[uVar26].x;
        lVar17.y = L'\0';
        lVar17.x = wVar15;
        wVar8 = path_grid[uVar26].y;
        _Var6 = square_ispassable(cave,path_grid[uVar26]);
        pcVar4 = cave;
        if ((!_Var6 && (char)local_1dc8.x == '\0') && (uVar25 == 0)) {
          uVar25 = 0;
          uVar23 = local_1dc0;
          break;
        }
        if ((uVar25 != 0) || (local_1d70 == uVar26)) {
          iVar20 = (int)local_1de0;
          blast_grid[iVar20].y = wVar8;
          blast_grid[iVar20].x = wVar15;
          distance_to_grid[iVar20] = L'\0';
          lVar10 = (loc)loc(wVar15,wVar8);
          psVar11 = square(pcVar4,lVar10);
          flag_on_dbg(psVar11->info,3,0x12,"square(cave, loc(x, y))->info","SQUARE_PROJECT");
          local_1de0 = (ulong)(iVar20 + 1);
        }
        pcVar4 = cave;
        if ((char)local_1da0 != '\0') {
          lVar10 = (loc)loc(wVar15,wVar8);
          _Var6 = square_isview(pcVar4,lVar10);
          event_signal_bolt(EVENT_BOLT,typ,false,_Var6,uVar25 != 0,(wchar_t)local_1dc0,local_1db0.x,
                            wVar8,wVar15);
        }
        uVar26 = uVar26 + 1;
        local_1dc0 = (ulong)(uint)wVar8;
        lVar10.y = L'\0';
        lVar10.x = wVar15;
        pvVar19 = local_1dd0;
        uVar23 = (ulong)(uint)wVar8;
        local_1db0 = lVar17;
      } while (local_1d68 != uVar26);
      local_1dc0 = uVar23;
      wVar15 = (wchar_t)local_1dd8;
      uVar23 = local_1d80;
      uVar26 = local_1d98;
    }
    else {
      local_1db0 = local_1d90;
      local_1dc0 = local_1d88;
      pvVar19 = local_1dd0;
    }
  }
  wVar8 = local_1d74;
  uVar22 = (uint)uVar26;
  uVar27 = local_1de0;
  if ((0 < (int)uVar22) && (uVar25 == 0)) {
    lVar18 = 0;
    if (((uint)wVar15 >> 10 & 1) == 0) {
      lVar29 = 0;
    }
    else {
      iVar20 = (int)uVar23;
      if (iVar20 == 0) {
        lVar29 = 0;
      }
      else {
        uVar26 = uVar26 & 0xffffffff;
        if (0x13 < uVar22) {
          uVar26 = 0x14;
        }
        iVar14 = iVar20 + -1;
        if (0x14 < iVar20) {
          iVar14 = 0x14;
        }
        lVar29 = (long)((path_grid[iVar14].y - (int)local_1d88) + 0x14);
        lVar18 = (long)((path_grid[iVar14].x - local_1d90.x) + 0x14);
        local_1db0 = (loc)((ulong)local_1d90 & 0xffffffff);
        local_1dc0 = local_1d88 & 0xffffffff;
      }
    }
    local_1d80 = uVar23;
    if ((int)local_1de0 == 0) {
      blast_grid[0].x = local_1db0.x;
      blast_grid[0].y = (wchar_t)local_1dc0;
      distance_to_grid[0] = L'\0';
      psVar11 = square(cave,(loc)((ulong)local_1db0 & 0xffffffff | local_1dc0 << 0x20));
      flag_on_dbg(psVar11->info,3,0x12,"square(cave, centre)->info","SQUARE_PROJECT");
      uVar27 = 1;
    }
    iVar14 = (int)uVar26;
    lVar12.x = (int)local_1dc0 - iVar14;
    iVar20 = iVar14 + (int)local_1dc0;
    if (iVar20 < (int)lVar12.x) {
      wVar15 = (wchar_t)local_1dd8;
    }
    else {
      wVar15 = local_1db0.x;
      local_1d40 = (ulong)(uint)(wVar15 - iVar14);
      lVar30 = (loc_conflict)((ulong)local_1db0 & 0xffffffff | local_1dc0 << 0x20);
      local_1d58 = get_angle_to_grid[lVar29] + lVar18;
      iVar3 = degrees_of_arc + L'\t';
      if (-1 < degrees_of_arc + L'\x06') {
        iVar3 = degrees_of_arc + L'\x06';
      }
      local_1d5c = iVar14 + wVar15;
      local_1d50 = (ulong)(uint)(iVar3 >> 2);
      local_1da0 = CONCAT44(local_1da0._4_4_,iVar14 + wVar15 + 1);
      lVar12.y = 0;
      uVar21 = local_1d80 & 0xffffffff;
      local_1d70 = CONCAT44(local_1d70._4_4_,iVar20 + 1);
      uVar23 = local_1dd8;
      local_1dc8 = lVar12;
      local_1d98 = uVar26;
      do {
        if ((int)local_1d40 <= local_1d5c) {
          local_1d48 = (long)((local_1dc8.x - (int)local_1d88) + 0x14);
          uVar26 = local_1d40;
          do {
            wVar15 = (wchar_t)uVar26;
            lVar10 = (loc)loc(wVar15,local_1dc8.x);
            _Var6 = loc_eq((loc_conflict)lVar10,lVar30);
            if (!_Var6) {
              if (0xfe < (int)uVar27) break;
              _Var6 = square_in_bounds(cave,lVar10);
              if (_Var6) {
                local_1de0 = uVar27;
                if (((uVar23 & 4) != 0) || (_Var6 = square_ispassable(cave,lVar10), _Var6)) {
                  _Var6 = square_isprojectable(cave,lVar10);
                  if (_Var6) {
LAB_001ad965:
                    wVar8 = distance(lVar30,(loc_conflict)lVar10);
                    uVar27 = local_1de0;
                    if (wVar8 <= (wchar_t)local_1d98) {
                      local_1d68 = CONCAT44(local_1d68._4_4_,wVar8);
                      if ((int)local_1d80 < 1) {
                        bVar31 = false;
                      }
                      else {
                        uVar27 = 0;
                        bVar31 = false;
                        do {
                          _Var6 = loc_eq((loc_conflict)lVar10,(loc_conflict)path_grid[uVar27]);
                          if (_Var6) {
                            bVar31 = true;
                          }
                          uVar27 = uVar27 + 1;
                          uVar23 = local_1dd8;
                        } while (uVar21 != uVar27);
                      }
                      if (((uint)uVar23 >> 10 & 1) == 0) {
LAB_001ada56:
                        _Var6 = los(cave,lVar30,(loc_conflict)lVar10);
                        uVar23 = local_1dd8;
                        uVar27 = local_1de0;
                        if (!_Var6 && !bVar31) goto LAB_001ad97e;
                      }
                      else {
                        iVar20 = (uint)get_angle_to_grid[local_1d48][(wVar15 - local_1d90.x) + 0x14]
                                 - (uint)*local_1d58;
                        uVar25 = iVar20 + 0x5a;
                        if (iVar20 < -0x5a) {
                          uVar25 = -(iVar20 + 0x5a);
                        }
                        iVar20 = (uVar25 - 0x5a) + (uVar25 / 0xb4) * -0xb4;
                        if (uVar25 % 0xb4 < 0x5b) {
                          iVar20 = 0x5a - uVar25 % 0xb4;
                        }
                        if (iVar20 < (int)local_1d50) goto LAB_001ada56;
                        uVar27 = local_1de0;
                        if (!bVar31) goto LAB_001ad97e;
                        los(cave,lVar30,(loc_conflict)lVar10);
                      }
                      iVar20 = (int)local_1de0;
                      blast_grid[iVar20].y = local_1dc8.x;
                      blast_grid[iVar20].x = wVar15;
                      distance_to_grid[iVar20] = (wchar_t)local_1d68;
                      psVar11 = square(cave,lVar10);
                      flag_on_dbg(psVar11->info,3,0x12,"square(cave, grid)->info","SQUARE_PROJECT");
                      uVar23 = local_1dd8;
                      uVar27 = (ulong)(iVar20 + 1);
                    }
                  }
                  else {
                    lVar18 = 0;
                    do {
                      lVar12 = loc_sum((loc_conflict)lVar10,(loc_conflict)ddgrid_ddd[lVar18]);
                      _Var6 = los(cave,lVar30,lVar12);
                      if (_Var6) goto LAB_001ad965;
                      lVar18 = lVar18 + 1;
                      uVar27 = local_1de0;
                    } while (lVar18 != 8);
                  }
                }
                else {
                  _Var6 = square_isprojectable(cave,lVar10);
                  uVar27 = local_1de0;
                  if (_Var6) goto LAB_001ad965;
                }
              }
            }
LAB_001ad97e:
            uVar26 = uVar26 + 1;
          } while ((int)local_1da0 != (int)uVar26);
        }
        wVar15 = (wchar_t)uVar23;
        local_1dc8 = (loc_conflict)((long)local_1dc8 + 1);
        pvVar19 = local_1dd0;
        uVar26 = local_1d98;
        wVar8 = local_1d74;
      } while ((int)local_1d70 != local_1dc8.x);
    }
  }
  uVar1 = z_info->max_range;
  wVar7 = (wchar_t)uVar26;
  lVar18 = 0;
  do {
    wVar9 = L'\0';
    if (lVar18 <= wVar7) {
      iVar20 = (int)lVar18;
      if (diameter_of_source == '\0' || lVar18 == 0) {
        wVar9 = (wVar8 + iVar20) / (iVar20 + 1);
      }
      else {
        wVar9 = ((uint)diameter_of_source * wVar8) / (iVar20 + 1);
        if ((uint)wVar8 <= (uint)wVar9) {
          wVar9 = wVar8;
        }
      }
    }
    *(wchar_t *)((long)pvVar19 + lVar18 * 4) = wVar9;
    lVar18 = lVar18 + 1;
  } while ((ulong)uVar1 + 1 != lVar18);
  wVar8 = (wchar_t)uVar27;
  if (L'\xffffffff' < wVar7) {
    wVar16 = L'\0';
    wVar9 = L'\0';
    do {
      if (wVar16 < wVar8) {
        lVar18 = (long)wVar16;
        do {
          if (distance_to_grid[lVar18] == wVar9) {
            wVar2 = distance_to_grid[wVar16];
            lVar10 = blast_grid[wVar16];
            blast_grid[wVar16] = blast_grid[lVar18];
            distance_to_grid[wVar16] = wVar9;
            blast_grid[lVar18] = lVar10;
            distance_to_grid[lVar18] = wVar2;
            wVar16 = wVar16 + L'\x01';
          }
          lVar18 = lVar18 + 1;
        } while (wVar8 != lVar18);
      }
      bVar31 = wVar9 != wVar7;
      wVar9 = wVar9 + L'\x01';
    } while (bVar31);
  }
  if (L'\0' < wVar8) {
    uVar26 = 0;
    do {
      _Var6 = panel_contains(blast_grid[uVar26].y,blast_grid[uVar26].x);
      if ((((!_Var6) || (_Var6 = square_isview(cave,blast_grid[uVar26]), !_Var6)) ||
          (local_1db2 != 0)) || (_Var6 = true, (wVar15 & 0x80U) != 0)) {
        _Var6 = false;
      }
      player_sees_grid[uVar26] = _Var6;
      uVar26 = uVar26 + 1;
    } while ((uVar27 & 0xffffffff) != uVar26);
  }
  uVar25 = 0;
  event_signal_blast(EVENT_EXPLOSION,typ,wVar8,distance_to_grid,false,player_sees_grid,
                     (loc_conflict *)blast_grid,
                     (loc_conflict)((ulong)local_1db0 & 0xffffffff | local_1dc0 << 0x20));
  aVar24 = local_1da8;
  pvVar19 = local_1dd0;
  local_1de0 = uVar27;
  if (((wVar15 & 0x20U) != 0) && (origin_01._4_4_ = 0, origin_01.what = local_1db8, L'\0' < wVar8))
  {
    local_1da0 = uVar27 & 0xffffffff;
    uVar26 = 0;
    uVar25 = 0;
    do {
      local_1dc8.x = uVar25;
      origin_01.which.trap = aVar24.trap;
      _Var6 = project_o(origin_01,distance_to_grid[uVar26],(loc_conflict)blast_grid[uVar26],
                        *(wchar_t *)((long)pvVar19 + (long)distance_to_grid[uVar26] * 4),typ,obj);
      uVar25 = CONCAT31(local_1dc8.x._1_3_,(byte)local_1dc8.x | _Var6);
      uVar26 = uVar26 + 1;
    } while (local_1da0 != uVar26);
  }
  uVar26 = local_1dd8;
  aVar24 = local_1da8;
  if ((local_1dd8 & 0x40) != 0) {
    iVar20 = 0;
    was_obvious = false;
    did_hit = false;
    lVar12 = loc(0,0);
    aVar24 = local_1da8;
    if (0 < (int)local_1de0) {
      local_1da0 = (ulong)lVar12 >> 0x20;
      uVar27 = local_1de0 & 0xffffffff;
      uVar23 = 0;
      local_1dc8 = lVar12;
      do {
        _Var6 = square_isproject(cave,blast_grid[uVar23]);
        if ((_Var6) &&
           (pmVar13 = square_monster(cave,blast_grid[uVar23]), uVar26 = local_1dd8,
           pmVar13 != (monster *)0x0)) {
          origin_02._4_4_ = 0;
          origin_02.what = local_1db8;
          origin_02.which.trap = local_1da8.trap;
          project_m(origin_02,distance_to_grid[uVar23],(loc_conflict)blast_grid[uVar23],
                    *(wchar_t *)((long)local_1dd0 + (long)distance_to_grid[uVar23] * 4),typ,
                    (wchar_t)local_1dd8,&did_hit,&was_obvious);
          uVar25 = (uint)(byte)((byte)uVar25 | was_obvious);
          uVar26 = local_1dd8;
          if (did_hit == true) {
            iVar20 = iVar20 + 1;
            local_1dc8.y = 0;
            local_1dc8.x = (pmVar13->grid).x;
            local_1da0 = (ulong)(uint)(pmVar13->grid).y;
          }
        }
        pcVar4 = cave;
        uVar23 = uVar23 + 1;
      } while (uVar27 != uVar23);
      pvVar19 = local_1dd0;
      aVar24 = local_1da8;
      if (local_1db8 == SRC_PLAYER && iVar20 == 1) {
        iVar14 = local_1dc8.x;
        iVar20 = (int)local_1da0;
        lVar10 = (loc)loc(iVar14,iVar20);
        psVar11 = square(pcVar4,lVar10);
        aVar24 = local_1da8;
        pcVar4 = cave;
        uVar26 = local_1dd8;
        pvVar19 = local_1dd0;
        if (0 < psVar11->mon) {
          lVar10 = (loc)loc(iVar14,iVar20);
          pmVar13 = square_monster(pcVar4,lVar10);
          _Var6 = monster_is_visible(pmVar13);
          uVar26 = local_1dd8;
          pvVar19 = local_1dd0;
          if (_Var6) {
            monster_race_track(player->upkeep,pmVar13->race);
            health_track(player->upkeep,pmVar13);
            uVar26 = local_1dd8;
            pvVar19 = local_1dd0;
          }
        }
      }
    }
  }
  bVar28 = (byte)uVar25;
  if (((uint)uVar26 >> 0xb & 1) != 0) {
    wVar15 = L'\0';
    if (local_1db8 == SRC_MONSTER) {
      pmVar13 = cave_monster(cave,aVar24.monster);
      wVar8 = pmVar13->race->spell_power;
      _Var6 = monster_is_powerful(pmVar13);
      wVar15 = L'P';
      if (L'P' < wVar8) {
        wVar15 = wVar8;
      }
      pvVar19 = local_1dd0;
      if (!_Var6) {
        wVar15 = wVar8;
      }
    }
    if ((int)local_1de0 < 1) goto LAB_001ae079;
    uVar21 = local_1de0 & 0xffffffff;
    uVar27 = 0;
    uVar23 = local_1dd8 >> 0xe;
    do {
      origin_03._4_4_ = 0;
      origin_03.what = local_1db8;
      origin_03.which.trap = local_1da8.trap;
      _Var6 = project_p(origin_03,distance_to_grid[uVar27],blast_grid[uVar27],
                        *(wchar_t *)((long)pvVar19 + (long)distance_to_grid[uVar27] * 4),typ,wVar15,
                        (_Bool)((byte)uVar23 & 1));
      uVar26 = local_1dd8;
      aVar24 = local_1da8;
      if (_Var6) {
        uVar25 = 1;
        if (player->is_dead == true) {
          free(pvVar19);
          bVar28 = 1;
          goto LAB_001ae09d;
        }
        break;
      }
      uVar27 = uVar27 + 1;
    } while (uVar21 != uVar27);
  }
  aVar5 = local_1db8;
  pvVar19 = local_1dd0;
  bVar28 = (byte)uVar25;
  if (((uVar26 & 0x10) != 0) && (0 < (int)local_1de0)) {
    local_1dc8 = (loc_conflict)(local_1de0 & 0xffffffff);
    lVar30.x = 0;
    lVar30.y = 0;
    do {
      origin_04._4_4_ = 0;
      origin_04.what = aVar5;
      origin_04.which.trap = aVar24.trap;
      _Var6 = project_f(origin_04,distance_to_grid[(long)lVar30],blast_grid[(long)lVar30],
                        *(wchar_t *)((long)pvVar19 + (long)distance_to_grid[(long)lVar30] * 4),typ);
      bVar28 = (byte)uVar25 | _Var6;
      uVar25 = (uint)bVar28;
      lVar30 = (loc_conflict)((long)lVar30 + 1);
    } while (local_1dc8 != lVar30);
  }
  pvVar19 = local_1dd0;
  if (0 < (int)local_1de0) {
    uVar26 = local_1de0 & 0xffffffff;
    uVar23 = 0;
    do {
      psVar11 = square(cave,blast_grid[uVar23]);
      flag_off(psVar11->info,3,0x12);
      uVar23 = uVar23 + 1;
    } while (uVar26 != uVar23);
  }
LAB_001ae079:
  if (player->upkeep->update != 0) {
    update_stuff(player);
  }
  free(pvVar19);
LAB_001ae09d:
  return (_Bool)(bVar28 & 1);
}

Assistant:

bool project(struct source origin, int rad, struct loc finish,
			 int dam, int typ, int flg,
			 int degrees_of_arc, uint8_t diameter_of_source,
			 const struct object *obj)
{
	int i, j, k, dist_from_centre;

	uint32_t dam_temp;

	struct loc centre;
	struct loc start;

	int n1y = 0;
	int n1x = 0;

	/* Assume the player sees nothing */
	bool notice = false;

	/* Notify the UI if it can draw this projection */
	bool drawing = false;

	/* Is the player blind? */
	bool blind = (player->timed[TMD_BLIND] ? true : false);

	/* Number of grids in the "path" */
	int num_path_grids = 0;

	/* Actual grids in the "path" */
	struct loc path_grid[512];

	/* Number of grids in the "blast area" (including the "beam" path) */
	int num_grids = 0;

	/* Coordinates of the affected grids */
	struct loc blast_grid[256];

	/* Distance to each of the affected grids. */
	int distance_to_grid[256];

	/* Player visibility of each of the affected grids. */
	bool player_sees_grid[256];

	/* Precalculated damage values for each distance. */
	int *dam_at_dist = malloc((z_info->max_range + 1) * sizeof(*dam_at_dist));

	/* Flush any pending output */
	handle_stuff(player);

	/* No projection path - jump to target */
	if (flg & PROJECT_JUMP) {
		start = finish;

		/* Clear the flag */
		flg &= ~(PROJECT_JUMP);
	} else {
		start = origin_get_loc(origin);

		/* Default to finish grid */
		if (start.y == -1 && start.x == -1) {
			start = finish;
		}
	}

	/* Default center of explosion (if any) */
	centre = start;

	/*
	 * An arc spell with no width and a non-zero radius is actually a
	 * beam of defined length.  Mark it as such.
	 */
	if ((flg & (PROJECT_ARC)) && (degrees_of_arc == 0) && (rad != 0)) {
		/* No longer an arc */
		flg &= ~(PROJECT_ARC);

		/* Now considered a beam */
		flg |= (PROJECT_BEAM);
		flg |= (PROJECT_THRU);
	}

	/*
	 * If a single grid is both start and finish (for example
	 * if PROJECT_JUMP is set), store it; otherwise, travel along the
	 * projection path.
	 */
	if (loc_eq(start, finish)) {
		blast_grid[num_grids] =  finish;
		centre = finish;
		distance_to_grid[num_grids] = 0;
		sqinfo_on(square(cave, finish)->info, SQUARE_PROJECT);
		num_grids++;
	} else {
		/* Start from caster */
		int y = start.y;
		int x = start.x;

		/* Calculate the projection path */
		num_path_grids = project_path(cave, path_grid,
			z_info->max_range, start, finish, flg);

		/* Some beams have limited length. */
		if (flg & (PROJECT_BEAM)) {
			/* Use length limit, if any is given. */
			if ((rad > 0) && (rad < num_path_grids)) {
				num_path_grids = rad;
			}
		}


		/* Project along the path (except for arcs) */
		if (!(flg & (PROJECT_ARC))) {
			for (i = 0; i < num_path_grids; ++i) {
				int oy = y;
				int ox = x;

				int ny = path_grid[i].y;
				int nx = path_grid[i].x;

				/* Hack -- Balls explode before reaching walls. */
				if (!square_ispassable(cave, path_grid[i]) && (rad > 0) &&
					!(flg & (PROJECT_BEAM)))
					break;

				/* Advance */
				y = ny;
				x = nx;

				/* Beams collect all grids in the path, all other methods
				 * collect only the final grid in the path. */
				if (flg & (PROJECT_BEAM)) {
					blast_grid[num_grids].y = y;
					blast_grid[num_grids].x = x;
					distance_to_grid[num_grids] = 0;
					sqinfo_on(square(cave, loc(x, y))->info, SQUARE_PROJECT);
					num_grids++;
				} else if (i == num_path_grids - 1) {
					blast_grid[num_grids].y = y;
					blast_grid[num_grids].x = x;
					distance_to_grid[num_grids] = 0;
					sqinfo_on(square(cave, loc(x, y))->info, SQUARE_PROJECT);
					num_grids++;
				}

				/* Only do visuals if requested and within range limit. */
				if (!blind && !(flg & (PROJECT_HIDE))) {
					bool seen = square_isview(cave, loc(x, y));
					bool beam = flg & (PROJECT_BEAM);

					/* Tell the UI to display the bolt */
					event_signal_bolt(EVENT_BOLT, typ, drawing, seen, beam, oy,
									  ox, y, x);
				}
			}
		}

		/* Save the "blast epicenter" */
		centre.y = y;
		centre.x = x;
	}

	/* Now check for explosions.  Beams have already stored all the grids they
	 * will affect; all non-beam projections with positive radius explode in
	 * some way */
	if ((rad > 0) && (!(flg & (PROJECT_BEAM)))) {
		int y, x;

		/* Pre-calculate some things for arcs. */
		if ((flg & (PROJECT_ARC)) && (num_path_grids != 0)) {
			/* Explosion centers on the caster. */
			centre = start;

			/* The radius of arcs cannot be more than 20 */
			if (rad > 20)
				rad = 20;

			/* Ensure legal access into get_angle_to_grid table */
			if (num_path_grids < 21)
				i = num_path_grids - 1;
			else
				i = 20;

			/* Reorient the grid forming the end of the arc's centerline. */
			n1y = path_grid[i].y - centre.y + 20;
			n1x = path_grid[i].x - centre.x + 20;
		}

		/* If the explosion centre hasn't been saved already, save it now. */
		if (num_grids == 0) {
			blast_grid[num_grids] = centre;
			distance_to_grid[num_grids] = 0;
			sqinfo_on(square(cave, centre)->info, SQUARE_PROJECT);
			num_grids++;
		}

		/* Scan every grid that might possibly be in the blast radius. */
		for (y = centre.y - rad; y <= centre.y + rad; y++) {
			for (x = centre.x - rad; x <= centre.x + rad; x++) {
				struct loc grid = loc(x, y);
				bool on_path = false;

				/* Center grid has already been stored. */
				if (loc_eq(grid, centre))
					continue;

				/* Precaution: Stay within area limit. */
				if (num_grids >= 255)
					break;

				/* Ignore "illegal" locations */
				if (!square_in_bounds(cave, grid))
					continue;

				/* Most explosions are immediately stopped by walls. If
				 * PROJECT_THRU is set, walls can be affected if adjacent to
				 * a grid visible from the explosion centre - note that as of
				 * Angband 3.5.0 there are no such explosions - NRM.
				 * All explosions can affect one layer of terrain which is
				 * passable but not projectable */
				if ((flg & (PROJECT_THRU)) || square_ispassable(cave, grid)) {
					/* If this is a wall grid, ... */
					if (!square_isprojectable(cave, grid)) {
						bool can_see_one = false;
						/* Check neighbors */
						for (i = 0; i < 8; i++) {
							struct loc adj_grid = loc_sum(grid, ddgrid_ddd[i]);
							if (los(cave, centre, adj_grid)) {
								can_see_one = true;
								break;
							}
						}

						/* Require at least one adjacent grid in LOS. */
						if (!can_see_one)
							continue;
					}
				} else if (!square_isprojectable(cave, grid))
					continue;

				/* Must be within maximum distance. */
				dist_from_centre  = (distance(centre, grid));
				if (dist_from_centre > rad)
					continue;

				/* Mark grids which are on the projection path */
				for (i = 0; i < num_path_grids; i++) {
					if (loc_eq(grid, path_grid[i])) {
						on_path = true;
					}
				}

				/* Do we need to consider a restricted angle? */
				if (flg & (PROJECT_ARC)) {
					/* Use angle comparison to delineate an arc. */
					int n2y, n2x, tmp, rotate, diff;

					/* Reorient current grid for table access. */
					n2y = y - start.y + 20;
					n2x = x - start.x + 20;

					/* Find the angular difference (/2) between the lines to
					 * the end of the arc's center-line and to the current grid.
					 */
					rotate = 90 - get_angle_to_grid[n1y][n1x];
					tmp = ABS(get_angle_to_grid[n2y][n2x] + rotate) % 180;
					diff = ABS(90 - tmp);

					/* If difference is greater then that allowed, skip it,
					 * unless it's on the target path */
					if ((diff >= (degrees_of_arc + 6) / 4) && !on_path)
						continue;
				}

				/* Accept remaining grids if in LOS or on the projection path */
				if (los(cave, centre, grid) || on_path) {
					blast_grid[num_grids].y = y;
					blast_grid[num_grids].x = x;
					distance_to_grid[num_grids] = dist_from_centre;
					sqinfo_on(square(cave, grid)->info, SQUARE_PROJECT);
					num_grids++;
				}
			}
		}
	}

	/* Calculate and store the actual damage at each distance. */
	for (i = 0; i <= z_info->max_range; i++) {
		if (i > rad) {
			/* No damage outside the radius. */
			dam_temp = 0;
		} else if ((!diameter_of_source) || (i == 0)) {
			/* Standard damage calc. for 10' source diameters, or at origin. */
			dam_temp = (dam + i) / (i + 1);
		} else {
			/* If a particular diameter for the source of the explosion's
			 * energy is given, it is full strength to that diameter and
			 * then reduces */
			dam_temp = (diameter_of_source * dam) / (i + 1);
			if (dam_temp > (uint32_t) dam) {
				dam_temp = dam;
			}
		}

		/* Store it. */
		dam_at_dist[i] = dam_temp;
	}


	/* Sort the blast grids by distance from the centre. */
	for (i = 0, k = 0; i <= rad; i++) {
		/* Collect all the grids of a given distance together. */
		for (j = k; j < num_grids; j++) {
			if (distance_to_grid[j] == i) {
				struct loc tmp;
				int tmp_d = distance_to_grid[k];
				tmp = blast_grid[k];

				blast_grid[k] = blast_grid[j];
				distance_to_grid[k] = distance_to_grid[j];

				blast_grid[j] = tmp;
				distance_to_grid[j] = tmp_d;

				/* Write to next slot */
				k++;
			}
		}
	}

	/* Establish which grids are visible - no blast visuals with PROJECT_HIDE */
	for (i = 0; i < num_grids; i++) {
		if (panel_contains(blast_grid[i].y, blast_grid[i].x) &&
			square_isview(cave, blast_grid[i]) &&
			!blind && !(flg & (PROJECT_HIDE))) {
			player_sees_grid[i] = true;
		} else {
			player_sees_grid[i] = false;
		}
	}

	/* Tell the UI to display the blast */
	event_signal_blast(EVENT_EXPLOSION, typ, num_grids, distance_to_grid,
					   drawing, player_sees_grid, blast_grid, centre);

	/* Affect objects on every relevant grid */
	if (flg & (PROJECT_ITEM)) {
		for (i = 0; i < num_grids; i++) {
			if (project_o(origin, distance_to_grid[i], blast_grid[i],
						  dam_at_dist[distance_to_grid[i]], typ, obj)) {
				notice = true;
			}
		}
	}

	/* Check monsters */
	if (flg & (PROJECT_KILL)) {
		bool was_obvious = false;
		bool did_hit = false;
		int num_hit = 0;
		struct loc last_hit_grid = loc(0, 0);

		/* Scan for monsters */
		for (i = 0; i < num_grids; i++) {
			struct monster *mon = NULL;

			/* Check this monster hasn't been processed already */
			if (!square_isproject(cave, blast_grid[i]))
				continue;

			/* Check there is actually a monster here */
			mon = square_monster(cave, blast_grid[i]);
			if (mon == NULL)
				continue;

			/* Affect the monster in the grid */
			project_m(origin, distance_to_grid[i], blast_grid[i],
			          dam_at_dist[distance_to_grid[i]], typ, flg,
			          &did_hit, &was_obvious);
			if (was_obvious) {
				notice = true;
			}
			if (did_hit) {
				num_hit++;

				/* Monster location may have been updated by project_m() */
				last_hit_grid = mon->grid;
			}
		}

		/* Player affected one monster (without "jumping") */
		if (origin.what == SRC_PLAYER &&
				num_hit == 1 &&
				!(flg & PROJECT_JUMP)) {
			/* Location */
			int x = last_hit_grid.x;
			int y = last_hit_grid.y;

			/* Track if possible */
			if (square(cave, loc(x, y))->mon > 0) {
				struct monster *mon = square_monster(cave, loc(x, y));

				/* Recall and track */
				if (monster_is_visible(mon)) {
					monster_race_track(player->upkeep, mon->race);
					health_track(player->upkeep, mon);
				}
			}
		}
	}

	/* Look for the player, affect them when found */
	if (flg & (PROJECT_PLAY)) {
		/* Set power */
		int power = 0;
		if (origin.what == SRC_MONSTER) {
			struct monster *mon = cave_monster(cave, origin.which.monster);
			power = mon->race->spell_power;

			/* Breaths from powerful monsters get power effects as well */
			if (monster_is_powerful(mon))
				power = MAX(power, 80);
		}
		for (i = 0; i < num_grids; i++) {
			if (project_p(origin, distance_to_grid[i], blast_grid[i],
						  dam_at_dist[distance_to_grid[i]], typ, power,
						  flg & PROJECT_SELF)) {
				notice = true;
				if (player->is_dead) {
					free(dam_at_dist);
					return notice;
				}
				break;
			}
		}
	}

	/* Affect features in every relevant grid */
	if (flg & (PROJECT_GRID)) {
		for (i = 0; i < num_grids; i++) {
			if (project_f(origin, distance_to_grid[i], blast_grid[i],
						  dam_at_dist[distance_to_grid[i]], typ)) {
				notice = true;
			}
		}
	}

	/* Clear all the processing marks. */
	for (i = 0; i < num_grids; i++) {
		/* Clear the mark */
		sqinfo_off(square(cave, blast_grid[i])->info, SQUARE_PROJECT);
	}

	/* Update stuff if needed */
	if (player->upkeep->update) update_stuff(player);

	free(dam_at_dist);

	/* Return "something was noticed" */
	return (notice);
}